

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O1

bool __thiscall
duckdb::PlanEnumerator::TryEmitPair
          (PlanEnumerator *this,JoinRelationSet *left,JoinRelationSet *right,
          vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *info)

{
  ulong uVar1;
  
  uVar1 = this->pairs + 1;
  this->pairs = uVar1;
  if (uVar1 < 10000) {
    EmitPair(this,left,right,info);
  }
  return uVar1 < 10000;
}

Assistant:

bool PlanEnumerator::TryEmitPair(JoinRelationSet &left, JoinRelationSet &right,
                                 const vector<reference<NeighborInfo>> &info) {
	pairs++;
	// If a full plan is created, it's possible a node in the plan gets updated. When this happens, make sure you keep
	// emitting pairs until you emit another final plan. Another final plan is guaranteed to be produced because of
	// our symmetry guarantees.
	if (pairs >= 10000) {
		// when the amount of pairs gets too large we exit the dynamic programming and resort to a greedy algorithm
		// FIXME: simple heuristic currently
		// at 10K pairs stop searching exactly and switch to heuristic
		return false;
	}
	EmitPair(left, right, info);
	return true;
}